

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssw.c
# Opt level: O2

s_profile * ssw_init(int8_t *read,int32_t readLen,int8_t *mat,int32_t n,int8_t score_size)

{
  uint8_t bias;
  s_profile *psVar1;
  __m128i *palVar2;
  uint8_t uVar3;
  ulong uVar4;
  
  psVar1 = (s_profile *)calloc(1,0x30);
  if ((score_size & 0xfdU) == 0) {
    uVar3 = '\0';
    for (uVar4 = 0; (uint)(n * n) != uVar4; uVar4 = uVar4 + 1) {
      if (mat[uVar4] <= (char)uVar3) {
        uVar3 = mat[uVar4];
      }
    }
    bias = -uVar3;
    if ('\0' < (char)uVar3) {
      bias = uVar3;
    }
    psVar1->bias = bias;
    palVar2 = qP_byte(read,mat,readLen,n,bias);
    psVar1->profile_byte = palVar2;
  }
  if ((byte)(score_size - 1U) < 2) {
    palVar2 = qP_word(read,mat,readLen,n);
    psVar1->profile_word = palVar2;
  }
  psVar1->read = read;
  psVar1->mat = mat;
  psVar1->readLen = readLen;
  psVar1->n = n;
  return psVar1;
}

Assistant:

s_profile* ssw_init (const int8_t* read, const int32_t readLen, const int8_t* mat, const int32_t n, const int8_t score_size) {
	s_profile* p = (s_profile*)calloc(1, sizeof(struct _profile));
	p->profile_byte = 0;
	p->profile_word = 0;
	p->bias = 0;

	if (score_size == 0 || score_size == 2) {
		/* Find the bias to use in the substitution matrix */
		int32_t bias = 0, i;
		for (i = 0; i < n*n; i++) if (mat[i] < bias) bias = mat[i];
		bias = abs(bias);

		p->bias = bias;
		p->profile_byte = qP_byte (read, mat, readLen, n, bias);
	}
	if (score_size == 1 || score_size == 2) p->profile_word = qP_word (read, mat, readLen, n);
	p->read = read;
	p->mat = mat;
	p->readLen = readLen;
	p->n = n;
	return p;
}